

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-options.c
# Opt level: O3

int run_test_udp_options6(void)

{
  ushort uVar1;
  int iVar2;
  int extraout_EAX;
  anon_union_28_2_e90107a3_for_address *paVar3;
  uv_loop_t *loop;
  uv_loop_t *puVar4;
  ulong uVar5;
  uv_loop_t *puVar6;
  uv_loop_t *puVar7;
  uv_loop_t *puVar8;
  uv_loop_t *puVar9;
  uv_loop_t *puVar10;
  bool bVar11;
  sockaddr_in6 addr;
  undefined1 auStack_1f0 [216];
  undefined1 auStack_118 [240];
  sockaddr_in6 local_28;
  
  auStack_118._216_8_ = (void *)0x1792a1;
  iVar2 = uv_interface_addresses
                    ((uv_interface_address_t **)(auStack_118 + 0xf0),(int *)(auStack_118 + 0xec));
  if (iVar2 != 0) {
LAB_00179312:
    auStack_118._216_8_ = (void *)0x179317;
    run_test_udp_options6_cold_1();
    return 1;
  }
  if ((long)(int)auStack_118._236_4_ < 1) {
    auStack_118._216_8_ = (void *)0x179312;
    uv_free_interface_addresses((uv_interface_address_t *)local_28._0_8_,auStack_118._236_4_);
    goto LAB_00179312;
  }
  paVar3 = (anon_union_28_2_e90107a3_for_address *)(local_28._0_8_ + 0x14);
  uVar5 = 1;
  do {
    uVar1 = (paVar3->address4).sin_family;
    if (uVar1 == 10) break;
    paVar3 = (anon_union_28_2_e90107a3_for_address *)((long)paVar3 + 0x50);
    bVar11 = uVar5 < (ulong)(long)(int)auStack_118._236_4_;
    uVar5 = uVar5 + 1;
  } while (bVar11);
  auStack_118._216_8_ = (void *)0x1792db;
  uv_free_interface_addresses((uv_interface_address_t *)local_28._0_8_,auStack_118._236_4_);
  if (uVar1 != 10) goto LAB_00179312;
  auStack_118._216_8_ = (void *)0x1792f7;
  iVar2 = uv_ip6_addr("::",0x23a3,(sockaddr_in6 *)(auStack_118 + 0xf0));
  if (iVar2 == 0) {
    auStack_118._216_8_ = (void *)0x179305;
    udp_options_test((sockaddr *)(auStack_118 + 0xf0));
    return 0;
  }
  auStack_118._216_8_ = run_test_udp_no_autobind;
  run_test_udp_options6_cold_2();
  puVar6 = (uv_loop_t *)auStack_1f0;
  puVar9 = (uv_loop_t *)auStack_1f0;
  puVar7 = (uv_loop_t *)auStack_1f0;
  puVar10 = (uv_loop_t *)auStack_1f0;
  puVar8 = (uv_loop_t *)auStack_1f0;
  auStack_118._216_8_ = (void *)(ulong)uVar1;
  loop = uv_default_loop();
  puVar4 = loop;
  iVar2 = uv_udp_init(loop,(uv_udp_t *)auStack_118);
  if (iVar2 == 0) {
    puVar4 = (uv_loop_t *)auStack_118;
    iVar2 = uv_udp_set_multicast_ttl((uv_udp_t *)puVar4,0x20);
    if (iVar2 != -9) goto LAB_001794c2;
    puVar4 = (uv_loop_t *)auStack_118;
    iVar2 = uv_udp_set_broadcast((uv_udp_t *)puVar4,1);
    if (iVar2 != -9) goto LAB_001794c7;
    puVar4 = (uv_loop_t *)auStack_118;
    iVar2 = uv_udp_set_ttl((uv_udp_t *)puVar4,1);
    if (iVar2 != -9) goto LAB_001794cc;
    puVar4 = (uv_loop_t *)auStack_118;
    iVar2 = uv_udp_set_multicast_loop((uv_udp_t *)puVar4,1);
    if (iVar2 != -9) goto LAB_001794d1;
    puVar4 = (uv_loop_t *)auStack_118;
    iVar2 = uv_udp_set_multicast_interface((uv_udp_t *)puVar4,"0.0.0.0");
    if (iVar2 != -9) goto LAB_001794d6;
    uv_close((uv_handle_t *)auStack_118,(uv_close_cb)0x0);
    puVar4 = loop;
    iVar2 = uv_udp_init_ex(loop,(uv_udp_t *)auStack_1f0,2);
    if (iVar2 != 0) goto LAB_001794db;
    iVar2 = uv_udp_set_multicast_ttl((uv_udp_t *)auStack_1f0,0x20);
    puVar4 = puVar6;
    if (iVar2 != 0) goto LAB_001794e0;
    iVar2 = uv_udp_set_broadcast((uv_udp_t *)auStack_1f0,1);
    if (iVar2 != 0) goto LAB_001794e5;
    iVar2 = uv_udp_set_ttl((uv_udp_t *)auStack_1f0,1);
    puVar9 = puVar7;
    if (iVar2 != 0) goto LAB_001794ea;
    iVar2 = uv_udp_set_multicast_loop((uv_udp_t *)auStack_1f0,1);
    if (iVar2 != 0) goto LAB_001794ef;
    iVar2 = uv_udp_set_multicast_interface((uv_udp_t *)auStack_1f0,"0.0.0.0");
    puVar10 = puVar8;
    if (iVar2 != 0) goto LAB_001794f4;
    uv_close((uv_handle_t *)auStack_1f0,(uv_close_cb)0x0);
    iVar2 = uv_run(loop,UV_RUN_DEFAULT);
    if (iVar2 == 0) {
      puVar4 = uv_default_loop();
      uv_walk(puVar4,close_walk_cb,(void *)0x0);
      uv_run(puVar4,UV_RUN_DEFAULT);
      loop = uv_default_loop();
      iVar2 = uv_loop_close(loop);
      if (iVar2 == 0) {
        return 0;
      }
      goto LAB_001794fe;
    }
  }
  else {
    run_test_udp_no_autobind_cold_1();
LAB_001794c2:
    run_test_udp_no_autobind_cold_2();
LAB_001794c7:
    run_test_udp_no_autobind_cold_3();
LAB_001794cc:
    run_test_udp_no_autobind_cold_4();
LAB_001794d1:
    run_test_udp_no_autobind_cold_5();
LAB_001794d6:
    run_test_udp_no_autobind_cold_6();
LAB_001794db:
    run_test_udp_no_autobind_cold_7();
LAB_001794e0:
    puVar9 = puVar4;
    run_test_udp_no_autobind_cold_8();
LAB_001794e5:
    run_test_udp_no_autobind_cold_9();
LAB_001794ea:
    puVar10 = puVar9;
    run_test_udp_no_autobind_cold_10();
LAB_001794ef:
    run_test_udp_no_autobind_cold_11();
LAB_001794f4:
    loop = puVar10;
    run_test_udp_no_autobind_cold_12();
  }
  run_test_udp_no_autobind_cold_13();
LAB_001794fe:
  run_test_udp_no_autobind_cold_14();
  iVar2 = uv_is_closing((uv_handle_t *)loop);
  if (iVar2 == 0) {
    uv_close((uv_handle_t *)loop,(uv_close_cb)0x0);
    return extraout_EAX;
  }
  return iVar2;
}

Assistant:

TEST_IMPL(udp_options6) {
  struct sockaddr_in6 addr;

  if (!can_ipv6())
    RETURN_SKIP("IPv6 not supported");

  ASSERT(0 == uv_ip6_addr("::", TEST_PORT, &addr));
  return udp_options_test((const struct sockaddr*) &addr);
}